

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

xmlRelaxNGContentType
xmlRelaxNGGroupContentType(xmlRelaxNGContentType ct1,xmlRelaxNGContentType ct2)

{
  if (ct2 == XML_RELAXNG_CONTENT_ERROR || ct1 == XML_RELAXNG_CONTENT_ERROR) {
    return XML_RELAXNG_CONTENT_ERROR;
  }
  if (ct1 != XML_RELAXNG_CONTENT_EMPTY) {
    if (ct2 == XML_RELAXNG_CONTENT_EMPTY) {
      return ct1;
    }
    ct2 = (uint)(ct2 == XML_RELAXNG_CONTENT_COMPLEX && ct1 == XML_RELAXNG_CONTENT_COMPLEX) * 3 +
          XML_RELAXNG_CONTENT_ERROR;
  }
  return ct2;
}

Assistant:

static xmlRelaxNGContentType
xmlRelaxNGGroupContentType(xmlRelaxNGContentType ct1,
                           xmlRelaxNGContentType ct2)
{
    if ((ct1 == XML_RELAXNG_CONTENT_ERROR) ||
        (ct2 == XML_RELAXNG_CONTENT_ERROR))
        return (XML_RELAXNG_CONTENT_ERROR);
    if (ct1 == XML_RELAXNG_CONTENT_EMPTY)
        return (ct2);
    if (ct2 == XML_RELAXNG_CONTENT_EMPTY)
        return (ct1);
    if ((ct1 == XML_RELAXNG_CONTENT_COMPLEX) &&
        (ct2 == XML_RELAXNG_CONTENT_COMPLEX))
        return (XML_RELAXNG_CONTENT_COMPLEX);
    return (XML_RELAXNG_CONTENT_ERROR);
}